

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

void __thiscall
wasm::TranslateToFuzzReader::addHangLimitChecks(TranslateToFuzzReader *this,Function *func)

{
  ArrayNew *pAVar1;
  uint32_t uVar2;
  Expression *pEVar3;
  Block *pBVar4;
  Expression *pEVar5;
  Const *pCVar6;
  _Storage<wasm::Type,_true> extraout_RDX;
  pointer ppAVar7;
  pointer ppAVar8;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  FindAll<wasm::ArrayNew> local_50;
  Function *local_38;
  
  FindAll<wasm::Loop>::FindAll((FindAll<wasm::Loop> *)&local_50,func->body);
  ppAVar8 = local_50.list.super__Vector_base<wasm::ArrayNew_*,_std::allocator<wasm::ArrayNew_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (local_50.list.super__Vector_base<wasm::ArrayNew_*,_std::allocator<wasm::ArrayNew_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_50.list.super__Vector_base<wasm::ArrayNew_*,_std::allocator<wasm::ArrayNew_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppAVar7 = local_50.list.super__Vector_base<wasm::ArrayNew_*,_std::allocator<wasm::ArrayNew_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    local_38 = func;
    do {
      pAVar1 = *ppAVar7;
      pEVar3 = makeHangLimitCheck(this);
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 1;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload =
           (_Storage<wasm::Type,_true>)
           (pAVar1->super_SpecificExpression<(wasm::Expression::Id)70>).super_Expression.type.id;
      pBVar4 = Builder::makeSequence
                         (&this->builder,pEVar3,
                          *(Expression **)
                           &pAVar1[1].super_SpecificExpression<(wasm::Expression::Id)70>.
                            super_Expression,type);
      *(Block **)&pAVar1[1].super_SpecificExpression<(wasm::Expression::Id)70>.super_Expression =
           pBVar4;
      ppAVar7 = ppAVar7 + 1;
      func = local_38;
    } while (ppAVar7 != ppAVar8);
  }
  if (local_50.list.super__Vector_base<wasm::ArrayNew_*,_std::allocator<wasm::ArrayNew_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.list.
                    super__Vector_base<wasm::ArrayNew_*,_std::allocator<wasm::ArrayNew_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.list.
                          super__Vector_base<wasm::ArrayNew_*,_std::allocator<wasm::ArrayNew_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.list.
                          super__Vector_base<wasm::ArrayNew_*,_std::allocator<wasm::ArrayNew_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pEVar5 = makeHangLimitCheck(this);
  pEVar3 = func->body;
  wasm::HeapType::getSignature();
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 1;
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = extraout_RDX;
  local_38 = (Function *)&this->builder;
  pBVar4 = Builder::makeSequence(&this->builder,pEVar5,pEVar3,type_00);
  func->body = (Expression *)pBVar4;
  FindAll<wasm::ArrayNew>::FindAll(&local_50,(Expression *)pBVar4);
  if (local_50.list.super__Vector_base<wasm::ArrayNew_*,_std::allocator<wasm::ArrayNew_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_50.list.super__Vector_base<wasm::ArrayNew_*,_std::allocator<wasm::ArrayNew_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppAVar8 = local_50.list.super__Vector_base<wasm::ArrayNew_*,_std::allocator<wasm::ArrayNew_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      pAVar1 = *ppAVar8;
      uVar2 = Random::upTo(&this->random,100);
      if (uVar2 != 0) {
        pEVar3 = pAVar1->size;
        pCVar6 = Builder::makeConst<int>((Builder *)local_38,0x3ff);
        pEVar5 = (Expression *)
                 MixedArena::allocSpace
                           (&(*(Module **)&local_38->super_Importable)->allocator,0x28,8);
        pEVar5->_id = BinaryId;
        (pEVar5->type).id = 0;
        *(undefined4 *)(pEVar5 + 1) = 7;
        pEVar5[1].type.id = (uintptr_t)pEVar3;
        *(Const **)(pEVar5 + 2) = pCVar6;
        wasm::Binary::finalize();
        pAVar1->size = pEVar5;
      }
      ppAVar8 = ppAVar8 + 1;
    } while (ppAVar8 !=
             local_50.list.super__Vector_base<wasm::ArrayNew_*,_std::allocator<wasm::ArrayNew_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_50.list.super__Vector_base<wasm::ArrayNew_*,_std::allocator<wasm::ArrayNew_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.list.
                    super__Vector_base<wasm::ArrayNew_*,_std::allocator<wasm::ArrayNew_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.list.
                          super__Vector_base<wasm::ArrayNew_*,_std::allocator<wasm::ArrayNew_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.list.
                          super__Vector_base<wasm::ArrayNew_*,_std::allocator<wasm::ArrayNew_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TranslateToFuzzReader::addHangLimitChecks(Function* func) {
  // loop limit
  for (auto* loop : FindAll<Loop>(func->body).list) {
    loop->body =
      builder.makeSequence(makeHangLimitCheck(), loop->body, loop->type);
  }
  // recursion limit
  func->body =
    builder.makeSequence(makeHangLimitCheck(), func->body, func->getResults());
  // ArrayNew can hang the fuzzer if the array size is massive. This doesn't
  // cause an OOM (which the fuzzer knows how to ignore) but it just works for
  // many seconds on building the array. To avoid that, limit the size with high
  // probability.
  for (auto* arrayNew : FindAll<ArrayNew>(func->body).list) {
    if (!oneIn(100)) {
      arrayNew->size = builder.makeBinary(
        AndInt32, arrayNew->size, builder.makeConst(int32_t(1024 - 1)));
    }
  }
}